

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadraticline.cpp
# Opt level: O2

void pzgeom::TPZQuadraticLine::TShape<double>
               (TPZVec<double> *loc,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double *pdVar2;
  
  dVar1 = *loc->fStore;
  pdVar2 = TPZFMatrix<double>::operator()(phi,0,0);
  *pdVar2 = (1.0 - dVar1) * dVar1 * -0.5;
  pdVar2 = TPZFMatrix<double>::operator()(phi,1,0);
  *pdVar2 = dVar1 * (dVar1 + 1.0) * 0.5;
  pdVar2 = TPZFMatrix<double>::operator()(phi,2,0);
  *pdVar2 = (dVar1 + 1.0) * (1.0 - dVar1);
  pdVar2 = TPZFMatrix<double>::operator()(dphi,0,0);
  *pdVar2 = dVar1 + -0.5;
  pdVar2 = TPZFMatrix<double>::operator()(dphi,0,1);
  *pdVar2 = dVar1 + 0.5;
  pdVar2 = TPZFMatrix<double>::operator()(dphi,0,2);
  *pdVar2 = dVar1 * -2.0;
  return;
}

Assistant:

void TPZQuadraticLine::TShape(const TPZVec<T> &loc,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
    
    T qsi = loc[0];
    
    phi(0,0)  = -qsi*(1.-qsi)/2.;
    phi(1,0)  = +qsi*(1.+qsi)/2.;
    phi(2,0)  = (1.-qsi)*(1.+qsi);
    
    dphi(0,0) = qsi-0.5;
    dphi(0,1) = qsi+0.5;
    dphi(0,2) = -2.*qsi;
}